

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void __thiscall IR::Opnd::SetValueType(Opnd *this,ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  ObjectType OVar4;
  RegOpnd *this_00;
  undefined4 *puVar5;
  Opnd *this_local;
  ValueType valueType_local;
  
  if ((this->field_0xb & 1) != 0) {
    return;
  }
  this_local._6_2_ = valueType.field_0;
  bVar2 = IsRegOpnd(this);
  if (bVar2) {
    this_00 = AsRegOpnd(this);
    bVar2 = RegOpnd::IsArrayRegOpnd(this_00);
    if (bVar2) {
      bVar2 = ValueType::IsObject((ValueType *)((long)&this_local + 6));
      if (bVar2) {
        OVar3 = ValueType::GetObjectType((ValueType *)((long)&this_local + 6));
        OVar4 = ValueType::GetObjectType(&this->m_valueType);
        if (OVar3 == OVar4) goto LAB_0082f3c7;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                         ,0x200,
                         "(!IsRegOpnd() || !AsRegOpnd()->IsArrayRegOpnd() || valueType.IsObject() && valueType.GetObjectType() == m_valueType.GetObjectType())"
                         ,
                         "!IsRegOpnd() || !AsRegOpnd()->IsArrayRegOpnd() || valueType.IsObject() && valueType.GetObjectType() == m_valueType.GetObjectType()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
LAB_0082f3c7:
  (this->m_valueType).field_0 = this_local._6_2_;
  return;
}

Assistant:

void Opnd::SetValueType(const ValueType valueType)
{
    if(m_isValueTypeFixed)
    {
        return;
    }

    // ArrayRegOpnd has information specific to the array type, so make sure that doesn't change
    Assert(
        !IsRegOpnd() ||
        !AsRegOpnd()->IsArrayRegOpnd() ||
        valueType.IsObject() && valueType.GetObjectType() == m_valueType.GetObjectType());

    m_valueType = valueType;
}